

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O3

int secp256k1_rangeproof_rewind_inner
              (secp256k1_scalar *blind,uint64_t *v,uchar *m,size_t *mlen,secp256k1_scalar *ev,
              secp256k1_scalar *s,size_t *rsizes,size_t rings,uchar *nonce,secp256k1_ge *commit,
              uchar *proof,size_t len,secp256k1_ge *genp)

{
  uint *puVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  uint uVar108;
  bool bVar109;
  int iVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  long lVar115;
  long lVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  secp256k1_scalar *psVar122;
  ulong uVar123;
  secp256k1_scalar *b;
  uint *puVar124;
  size_t sVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  ulong uVar135;
  ulong uVar136;
  ulong uVar137;
  ulong uVar138;
  ulong uVar139;
  ulong uVar140;
  ulong uVar141;
  ulong uVar142;
  ulong uVar143;
  long lVar144;
  bool bVar145;
  uchar tmp [32];
  secp256k1_scalar stmp;
  secp256k1_scalar stmp_1;
  uint64_t l [8];
  secp256k1_scalar sec [32];
  uchar prep [4096];
  secp256k1_scalar s_orig [128];
  undefined8 local_2508;
  undefined8 uStack_2500;
  uint64_t local_24f8;
  uint64_t uStack_24f0;
  ulong local_24e8;
  uchar *local_24e0;
  ulong local_24d8;
  secp256k1_scalar *local_24d0;
  long local_24c8;
  ulong local_24c0;
  secp256k1_scalar local_24b8;
  secp256k1_scalar local_2498;
  uint64_t local_2478;
  long local_2470;
  long local_2468;
  long local_2460;
  long local_2458;
  long local_2450;
  undefined1 local_2448 [16];
  secp256k1_scalar local_2438 [32];
  uint local_2038 [2];
  undefined8 uStack_2030;
  uint64_t auStack_2028 [510];
  secp256k1_scalar local_1038 [128];
  
  memset(local_2038,0,0x1000);
  secp256k1_rangeproof_genrand
            (local_2438,local_1038,(uchar *)local_2038,rsizes,rings,nonce,commit,proof,len,genp);
  *v = 0xffffffffffffffff;
  blind->d[0] = 0;
  blind->d[1] = 0;
  blind->d[2] = 0;
  blind->d[3] = 0;
  if ((rings == 1) && (*rsizes == 1)) {
    secp256k1_scalar_negate(blind,s);
    secp256k1_scalar_add(blind,blind,local_1038);
    secp256k1_scalar_inverse(&local_2498,ev);
    uVar112 = blind->d[0];
    uVar113 = blind->d[1];
    uVar114 = blind->d[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar112;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_2498.d[0];
    uVar117 = SUB168(auVar3 * auVar51,8);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar117;
    local_2478 = SUB168(auVar3 * auVar51,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar112;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_2498.d[1];
    auVar4 = auVar4 * auVar52;
    uVar126 = SUB168(auVar4 + auVar101,0);
    uVar134 = SUB168(auVar4 + auVar101,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar113;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_2498.d[0];
    uVar118 = SUB168(auVar5 * auVar53,8);
    uVar111 = SUB168(auVar5 * auVar53,0);
    local_2470 = uVar126 + uVar111;
    uVar111 = (ulong)CARRY8(uVar126,uVar111);
    uVar126 = uVar134 + uVar118;
    uVar135 = uVar126 + uVar111;
    uVar136 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar117,auVar4._0_8_)) +
              (ulong)(CARRY8(uVar134,uVar118) || CARRY8(uVar126,uVar111));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar112;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_2498.d[2];
    uVar119 = SUB168(auVar6 * auVar54,8);
    uVar111 = SUB168(auVar6 * auVar54,0);
    uVar117 = uVar135 + uVar111;
    uVar111 = (ulong)CARRY8(uVar135,uVar111);
    uVar118 = uVar136 + uVar119;
    uVar137 = uVar118 + uVar111;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar113;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_2498.d[1];
    uVar120 = SUB168(auVar7 * auVar55,8);
    uVar126 = SUB168(auVar7 * auVar55,0);
    uVar135 = uVar117 + uVar126;
    uVar126 = (ulong)CARRY8(uVar117,uVar126);
    uVar134 = uVar137 + uVar120;
    uVar138 = uVar134 + uVar126;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar114;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_2498.d[0];
    uVar121 = SUB168(auVar8 * auVar56,8);
    uVar117 = SUB168(auVar8 * auVar56,0);
    local_2468 = uVar135 + uVar117;
    uVar117 = (ulong)CARRY8(uVar135,uVar117);
    uVar135 = uVar138 + uVar121;
    uVar139 = uVar135 + uVar117;
    uVar127 = (ulong)(CARRY8(uVar136,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar137,uVar120) || CARRY8(uVar134,uVar126)) +
              (ulong)(CARRY8(uVar138,uVar121) || CARRY8(uVar135,uVar117));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar112;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_2498.d[3];
    uVar121 = SUB168(auVar9 * auVar57,8);
    uVar112 = SUB168(auVar9 * auVar57,0);
    uVar117 = uVar139 + uVar112;
    uVar111 = (ulong)CARRY8(uVar139,uVar112);
    uVar134 = uVar127 + uVar121;
    uVar139 = uVar134 + uVar111;
    uVar112 = blind->d[3];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar113;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_2498.d[2];
    uVar136 = SUB168(auVar10 * auVar58,8);
    uVar126 = SUB168(auVar10 * auVar58,0);
    uVar118 = uVar117 + uVar126;
    uVar126 = (ulong)CARRY8(uVar117,uVar126);
    uVar135 = uVar139 + uVar136;
    uVar128 = uVar135 + uVar126;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar114;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_2498.d[1];
    uVar137 = SUB168(auVar11 * auVar59,8);
    uVar117 = SUB168(auVar11 * auVar59,0);
    uVar120 = uVar118 + uVar117;
    uVar117 = (ulong)CARRY8(uVar118,uVar117);
    uVar119 = uVar128 + uVar137;
    uVar129 = uVar119 + uVar117;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar112;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_2498.d[0];
    uVar138 = SUB168(auVar12 * auVar60,8);
    uVar118 = SUB168(auVar12 * auVar60,0);
    local_2460 = uVar120 + uVar118;
    uVar118 = (ulong)CARRY8(uVar120,uVar118);
    uVar120 = uVar129 + uVar138;
    uVar130 = uVar120 + uVar118;
    uVar121 = (ulong)(CARRY8(uVar127,uVar121) || CARRY8(uVar134,uVar111)) +
              (ulong)(CARRY8(uVar139,uVar136) || CARRY8(uVar135,uVar126)) +
              (ulong)(CARRY8(uVar128,uVar137) || CARRY8(uVar119,uVar117)) +
              (ulong)(CARRY8(uVar129,uVar138) || CARRY8(uVar120,uVar118));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar113;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_2498.d[3];
    uVar135 = SUB168(auVar13 * auVar61,8);
    uVar113 = SUB168(auVar13 * auVar61,0);
    uVar126 = uVar130 + uVar113;
    uVar113 = (ulong)CARRY8(uVar130,uVar113);
    uVar117 = uVar121 + uVar135;
    uVar136 = uVar117 + uVar113;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar114;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_2498.d[2];
    uVar119 = SUB168(auVar14 * auVar62,8);
    uVar111 = SUB168(auVar14 * auVar62,0);
    uVar134 = uVar126 + uVar111;
    uVar111 = (ulong)CARRY8(uVar126,uVar111);
    uVar118 = uVar136 + uVar119;
    uVar137 = uVar118 + uVar111;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar112;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_2498.d[1];
    uVar120 = SUB168(auVar15 * auVar63,8);
    uVar126 = SUB168(auVar15 * auVar63,0);
    local_2458 = uVar134 + uVar126;
    uVar126 = (ulong)CARRY8(uVar134,uVar126);
    uVar134 = uVar137 + uVar120;
    uVar138 = uVar134 + uVar126;
    uVar134 = (ulong)(CARRY8(uVar121,uVar135) || CARRY8(uVar117,uVar113)) +
              (ulong)(CARRY8(uVar136,uVar119) || CARRY8(uVar118,uVar111)) +
              (ulong)(CARRY8(uVar137,uVar120) || CARRY8(uVar134,uVar126));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar114;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_2498.d[3];
    uVar117 = SUB168(auVar16 * auVar64,8);
    uVar113 = SUB168(auVar16 * auVar64,0);
    uVar126 = uVar138 + uVar113;
    uVar113 = (ulong)CARRY8(uVar138,uVar113);
    uVar111 = uVar134 + uVar117;
    uVar135 = uVar111 + uVar113;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar112;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_2498.d[2];
    uVar118 = SUB168(auVar17 * auVar65,8);
    uVar114 = SUB168(auVar17 * auVar65,0);
    local_2450 = uVar126 + uVar114;
    uVar114 = (ulong)CARRY8(uVar126,uVar114);
    uVar126 = uVar135 + uVar118;
    local_2448._8_8_ =
         (ulong)(CARRY8(uVar134,uVar117) || CARRY8(uVar111,uVar113)) +
         (ulong)(CARRY8(uVar135,uVar118) || CARRY8(uVar126,uVar114));
    local_2448._0_8_ = uVar126 + uVar114;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar112;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_2498.d[3];
    local_2448 = auVar18 * auVar66 + local_2448;
    secp256k1_scalar_reduce_512(blind,&local_2478);
    *v = 0;
LAB_004f8b7d:
    iVar110 = 1;
LAB_004f8c3b:
    if (mlen != (size_t *)0x0) {
LAB_004f8c40:
      uVar113 = 0;
LAB_004f8c42:
      *mlen = uVar113;
    }
    return iVar110;
  }
  uVar112 = rings * 4 - 4;
  sVar2 = rsizes[rings - 1];
  lVar115 = -1;
  bVar145 = true;
  local_24e0 = m;
LAB_004f8bc1:
  lVar144 = uVar112 + lVar115 + sVar2;
  secp256k1_scalar_get_b32((uchar *)&local_2508,s + lVar144);
  lVar116 = 0;
  do {
    uVar104 = *(uint *)((long)&uStack_2500 + lVar116);
    uVar105 = *(uint *)((long)&uStack_2500 + lVar116 + 4);
    puVar124 = (uint *)((long)(local_2038 + lVar144 * 8) + lVar116);
    uVar106 = puVar124[1];
    uVar107 = puVar124[2];
    uVar108 = puVar124[3];
    *(uint *)((long)&local_2508 + lVar116) = *(uint *)((long)&local_2508 + lVar116) ^ *puVar124;
    *(uint *)((long)&local_2508 + lVar116 + 4) =
         *(uint *)((long)&local_2508 + lVar116 + 4) ^ uVar106;
    *(uint *)((long)&uStack_2500 + lVar116) = uVar104 ^ uVar107;
    *(uint *)((long)&uStack_2500 + lVar116 + 4) = uVar105 ^ uVar108;
    lVar116 = lVar116 + 0x10;
  } while (lVar116 != 0x20);
  if (((-1 < (char)(uchar)local_2508) || (local_24f8 != uStack_24f0)) || (uStack_2500 != local_24f8)
     ) goto LAB_004f8c26;
  lVar116 = 0x18;
  local_24d8 = 0;
  do {
    local_24d8 = (ulong)*(byte *)((long)&local_2508 + lVar116) | local_24d8 << 8;
    lVar116 = lVar116 + 1;
  } while (lVar116 != 0x20);
  *v = local_24d8;
  auStack_2028[lVar144 * 4] = local_24f8;
  local_1038[lVar144 + -0x80].d[3] = uStack_24f0;
  *(ulong *)(local_2038 + lVar144 * 8) = CONCAT71(local_2508._1_7_,(uchar)local_2508);
  (&uStack_2030)[lVar144 * 4] = uStack_2500;
  sVar2 = rsizes[rings - 1];
  local_24e8 = (ulong)((uint)(local_24d8 >> ((char)(rings - 1) * '\x02' & 0x3fU)) & 3);
  if (lVar115 + sVar2 == local_24e8) {
    iVar110 = 0;
    goto LAB_004f8c3b;
  }
  local_24e8 = local_24e8 | uVar112;
  b = local_1038 + local_24e8;
  psVar122 = ev + local_24e8;
  secp256k1_scalar_negate(&local_24b8,s + local_24e8);
  secp256k1_scalar_add(&local_24b8,&local_24b8,b);
  secp256k1_scalar_inverse(&local_2498,psVar122);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_24b8.d[0];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_2498.d[0];
  uVar111 = SUB168(auVar19 * auVar67,8);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar111;
  local_2478 = SUB168(auVar19 * auVar67,0);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_24b8.d[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_2498.d[1];
  auVar20 = auVar20 * auVar68;
  uVar114 = SUB168(auVar20 + auVar102,0);
  uVar117 = SUB168(auVar20 + auVar102,8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_24b8.d[1];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_2498.d[0];
  uVar126 = SUB168(auVar21 * auVar69,8);
  uVar113 = SUB168(auVar21 * auVar69,0);
  local_2470 = uVar114 + uVar113;
  uVar113 = (ulong)CARRY8(uVar114,uVar113);
  uVar114 = uVar117 + uVar126;
  uVar118 = uVar114 + uVar113;
  uVar120 = (ulong)CARRY8(auVar20._8_8_,(ulong)CARRY8(uVar111,auVar20._0_8_)) +
            (ulong)(CARRY8(uVar117,uVar126) || CARRY8(uVar114,uVar113));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_24b8.d[0];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_2498.d[2];
  uVar134 = SUB168(auVar22 * auVar70,8);
  uVar113 = SUB168(auVar22 * auVar70,0);
  uVar111 = uVar118 + uVar113;
  uVar113 = (ulong)CARRY8(uVar118,uVar113);
  uVar126 = uVar120 + uVar134;
  uVar121 = uVar126 + uVar113;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_24b8.d[1];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_2498.d[1];
  uVar135 = SUB168(auVar23 * auVar71,8);
  uVar114 = SUB168(auVar23 * auVar71,0);
  uVar118 = uVar111 + uVar114;
  uVar114 = (ulong)CARRY8(uVar111,uVar114);
  uVar117 = uVar121 + uVar135;
  uVar136 = uVar117 + uVar114;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_24b8.d[2];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_2498.d[0];
  uVar119 = SUB168(auVar24 * auVar72,8);
  uVar111 = SUB168(auVar24 * auVar72,0);
  local_2468 = uVar118 + uVar111;
  uVar111 = (ulong)CARRY8(uVar118,uVar111);
  uVar118 = uVar136 + uVar119;
  uVar138 = uVar118 + uVar111;
  uVar137 = (ulong)(CARRY8(uVar120,uVar134) || CARRY8(uVar126,uVar113)) +
            (ulong)(CARRY8(uVar121,uVar135) || CARRY8(uVar117,uVar114)) +
            (ulong)(CARRY8(uVar136,uVar119) || CARRY8(uVar118,uVar111));
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_24b8.d[0];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_2498.d[3];
  uVar119 = SUB168(auVar25 * auVar73,8);
  uVar113 = SUB168(auVar25 * auVar73,0);
  uVar111 = uVar138 + uVar113;
  uVar113 = (ulong)CARRY8(uVar138,uVar113);
  uVar117 = uVar137 + uVar119;
  uVar138 = uVar117 + uVar113;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_24b8.d[1];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_2498.d[2];
  uVar120 = SUB168(auVar26 * auVar74,8);
  uVar114 = SUB168(auVar26 * auVar74,0);
  uVar126 = uVar111 + uVar114;
  uVar114 = (ulong)CARRY8(uVar111,uVar114);
  uVar118 = uVar138 + uVar120;
  uVar127 = uVar118 + uVar114;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_24b8.d[2];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_2498.d[1];
  uVar121 = SUB168(auVar27 * auVar75,8);
  uVar111 = SUB168(auVar27 * auVar75,0);
  uVar135 = uVar126 + uVar111;
  uVar111 = (ulong)CARRY8(uVar126,uVar111);
  uVar134 = uVar127 + uVar121;
  uVar139 = uVar134 + uVar111;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_24b8.d[3];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_2498.d[0];
  uVar136 = SUB168(auVar28 * auVar76,8);
  uVar126 = SUB168(auVar28 * auVar76,0);
  local_2460 = uVar135 + uVar126;
  uVar126 = (ulong)CARRY8(uVar135,uVar126);
  uVar135 = uVar139 + uVar136;
  uVar128 = uVar135 + uVar126;
  uVar120 = (ulong)(CARRY8(uVar137,uVar119) || CARRY8(uVar117,uVar113)) +
            (ulong)(CARRY8(uVar138,uVar120) || CARRY8(uVar118,uVar114)) +
            (ulong)(CARRY8(uVar127,uVar121) || CARRY8(uVar134,uVar111)) +
            (ulong)(CARRY8(uVar139,uVar136) || CARRY8(uVar135,uVar126));
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_24b8.d[1];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_2498.d[3];
  uVar134 = SUB168(auVar29 * auVar77,8);
  uVar113 = SUB168(auVar29 * auVar77,0);
  uVar111 = uVar128 + uVar113;
  uVar113 = (ulong)CARRY8(uVar128,uVar113);
  uVar126 = uVar120 + uVar134;
  uVar121 = uVar126 + uVar113;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_24b8.d[2];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_2498.d[2];
  uVar135 = SUB168(auVar30 * auVar78,8);
  uVar114 = SUB168(auVar30 * auVar78,0);
  uVar118 = uVar111 + uVar114;
  uVar114 = (ulong)CARRY8(uVar111,uVar114);
  uVar117 = uVar121 + uVar135;
  uVar136 = uVar117 + uVar114;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_24b8.d[3];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_2498.d[1];
  uVar119 = SUB168(auVar31 * auVar79,8);
  uVar111 = SUB168(auVar31 * auVar79,0);
  local_2458 = uVar118 + uVar111;
  uVar111 = (ulong)CARRY8(uVar118,uVar111);
  uVar118 = uVar136 + uVar119;
  uVar137 = uVar118 + uVar111;
  uVar134 = (ulong)(CARRY8(uVar120,uVar134) || CARRY8(uVar126,uVar113)) +
            (ulong)(CARRY8(uVar121,uVar135) || CARRY8(uVar117,uVar114)) +
            (ulong)(CARRY8(uVar136,uVar119) || CARRY8(uVar118,uVar111));
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_24b8.d[2];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_2498.d[3];
  uVar117 = SUB168(auVar32 * auVar80,8);
  uVar113 = SUB168(auVar32 * auVar80,0);
  uVar126 = uVar137 + uVar113;
  uVar113 = (ulong)CARRY8(uVar137,uVar113);
  uVar111 = uVar134 + uVar117;
  uVar135 = uVar111 + uVar113;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_24b8.d[3];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_2498.d[2];
  uVar118 = SUB168(auVar33 * auVar81,8);
  uVar114 = SUB168(auVar33 * auVar81,0);
  local_2450 = uVar126 + uVar114;
  uVar114 = (ulong)CARRY8(uVar126,uVar114);
  uVar126 = uVar135 + uVar118;
  auVar99._8_8_ =
       (ulong)(CARRY8(uVar134,uVar117) || CARRY8(uVar111,uVar113)) +
       (ulong)(CARRY8(uVar135,uVar118) || CARRY8(uVar126,uVar114));
  auVar99._0_8_ = uVar126 + uVar114;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_24b8.d[3];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_2498.d[3];
  local_2448 = auVar34 * auVar82 + auVar99;
  secp256k1_scalar_reduce_512(&local_24b8,&local_2478);
  psVar122 = local_2438 + (rings - 1);
  secp256k1_scalar_negate(psVar122,psVar122);
  secp256k1_scalar_add(blind,&local_24b8,psVar122);
  if (mlen == (size_t *)0x0 || local_24e0 == (uchar *)0x0) goto LAB_004f8b7d;
  iVar110 = 1;
  if (rings == 0 || *mlen == 0) goto LAB_004f8c40;
  uVar111 = 0;
  sVar125 = 0;
  uVar113 = 0;
  uVar114 = local_24e8;
  do {
    uVar126 = rsizes[sVar125];
    if (uVar126 != 0) {
      uVar118 = (ulong)((uint)(local_24d8 >> ((char)sVar125 * '\x02' & 0x3fU)) & 3);
      local_24d0 = local_2438 + sVar125;
      puVar124 = local_2038 + uVar111 * 8;
      uVar134 = 0;
      uVar117 = uVar113;
      local_24c0 = uVar118;
      do {
        uVar135 = local_24e8;
        uVar113 = uVar117;
        if ((uVar111 != lVar115 + sVar2 + uVar112) && (uVar111 != uVar114)) {
          if (uVar118 == uVar134) {
            local_24c8 = uVar111 * 0x20;
            psVar122 = ev + uVar111;
            uVar113 = local_24d0->d[0];
            uVar114 = local_24d0->d[1];
            uVar126 = local_24d0->d[2];
            uVar118 = psVar122->d[0];
            uVar119 = psVar122->d[1];
            uVar120 = psVar122->d[2];
            uVar121 = psVar122->d[3];
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar113;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar118;
            uVar138 = SUB168(auVar35 * auVar83,8);
            auVar103._8_8_ = 0;
            auVar103._0_8_ = uVar138;
            local_2478 = SUB168(auVar35 * auVar83,0);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar113;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = uVar119;
            auVar36 = auVar36 * auVar84;
            uVar137 = SUB168(auVar36 + auVar103,0);
            uVar139 = SUB168(auVar36 + auVar103,8);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar114;
            auVar85._8_8_ = 0;
            auVar85._0_8_ = uVar118;
            uVar127 = SUB168(auVar37 * auVar85,8);
            uVar136 = SUB168(auVar37 * auVar85,0);
            local_2470 = uVar137 + uVar136;
            uVar136 = (ulong)CARRY8(uVar137,uVar136);
            uVar137 = uVar139 + uVar127;
            uVar128 = uVar137 + uVar136;
            uVar140 = (ulong)CARRY8(auVar36._8_8_,(ulong)CARRY8(uVar138,auVar36._0_8_)) +
                      (ulong)(CARRY8(uVar139,uVar127) || CARRY8(uVar137,uVar136));
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar113;
            auVar86._8_8_ = 0;
            auVar86._0_8_ = uVar120;
            uVar129 = SUB168(auVar38 * auVar86,8);
            uVar136 = SUB168(auVar38 * auVar86,0);
            uVar138 = uVar128 + uVar136;
            uVar136 = (ulong)CARRY8(uVar128,uVar136);
            uVar127 = uVar140 + uVar129;
            uVar141 = uVar127 + uVar136;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar114;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = uVar119;
            uVar130 = SUB168(auVar39 * auVar87,8);
            uVar137 = SUB168(auVar39 * auVar87,0);
            uVar128 = uVar138 + uVar137;
            uVar137 = (ulong)CARRY8(uVar138,uVar137);
            uVar139 = uVar141 + uVar130;
            uVar142 = uVar139 + uVar137;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = uVar126;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = uVar118;
            uVar123 = SUB168(auVar40 * auVar88,8);
            uVar138 = SUB168(auVar40 * auVar88,0);
            local_2468 = uVar128 + uVar138;
            uVar138 = (ulong)CARRY8(uVar128,uVar138);
            uVar128 = uVar142 + uVar123;
            uVar143 = uVar128 + uVar138;
            uVar142 = (ulong)(CARRY8(uVar140,uVar129) || CARRY8(uVar127,uVar136)) +
                      (ulong)(CARRY8(uVar141,uVar130) || CARRY8(uVar139,uVar137)) +
                      (ulong)(CARRY8(uVar142,uVar123) || CARRY8(uVar128,uVar138));
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar113;
            auVar89._8_8_ = 0;
            auVar89._0_8_ = uVar121;
            uVar130 = SUB168(auVar41 * auVar89,8);
            uVar113 = SUB168(auVar41 * auVar89,0);
            uVar138 = uVar143 + uVar113;
            uVar136 = (ulong)CARRY8(uVar143,uVar113);
            uVar127 = uVar142 + uVar130;
            uVar143 = uVar127 + uVar136;
            uVar113 = local_24d0->d[3];
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar114;
            auVar90._8_8_ = 0;
            auVar90._0_8_ = uVar120;
            uVar123 = SUB168(auVar42 * auVar90,8);
            uVar137 = SUB168(auVar42 * auVar90,0);
            uVar128 = uVar138 + uVar137;
            uVar137 = (ulong)CARRY8(uVar138,uVar137);
            uVar139 = uVar143 + uVar123;
            uVar131 = uVar139 + uVar137;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar126;
            auVar91._8_8_ = 0;
            auVar91._0_8_ = uVar119;
            uVar140 = SUB168(auVar43 * auVar91,8);
            uVar138 = SUB168(auVar43 * auVar91,0);
            uVar129 = uVar128 + uVar138;
            uVar138 = (ulong)CARRY8(uVar128,uVar138);
            uVar128 = uVar131 + uVar140;
            uVar132 = uVar128 + uVar138;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar113;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = uVar118;
            uVar141 = SUB168(auVar44 * auVar92,8);
            uVar118 = SUB168(auVar44 * auVar92,0);
            local_2460 = uVar129 + uVar118;
            uVar118 = (ulong)CARRY8(uVar129,uVar118);
            uVar129 = uVar132 + uVar141;
            uVar133 = uVar129 + uVar118;
            uVar129 = (ulong)(CARRY8(uVar142,uVar130) || CARRY8(uVar127,uVar136)) +
                      (ulong)(CARRY8(uVar143,uVar123) || CARRY8(uVar139,uVar137)) +
                      (ulong)(CARRY8(uVar131,uVar140) || CARRY8(uVar128,uVar138)) +
                      (ulong)(CARRY8(uVar132,uVar141) || CARRY8(uVar129,uVar118));
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar114;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = uVar121;
            uVar127 = SUB168(auVar45 * auVar93,8);
            uVar114 = SUB168(auVar45 * auVar93,0);
            uVar137 = uVar133 + uVar114;
            uVar114 = (ulong)CARRY8(uVar133,uVar114);
            uVar136 = uVar129 + uVar127;
            uVar130 = uVar136 + uVar114;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar126;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = uVar120;
            uVar139 = SUB168(auVar46 * auVar94,8);
            uVar118 = SUB168(auVar46 * auVar94,0);
            uVar138 = uVar137 + uVar118;
            uVar118 = (ulong)CARRY8(uVar137,uVar118);
            uVar137 = uVar130 + uVar139;
            uVar123 = uVar137 + uVar118;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar113;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = uVar119;
            uVar128 = SUB168(auVar47 * auVar95,8);
            uVar119 = SUB168(auVar47 * auVar95,0);
            local_2458 = uVar138 + uVar119;
            uVar119 = (ulong)CARRY8(uVar138,uVar119);
            uVar138 = uVar123 + uVar128;
            uVar140 = uVar138 + uVar119;
            uVar137 = (ulong)(CARRY8(uVar129,uVar127) || CARRY8(uVar136,uVar114)) +
                      (ulong)(CARRY8(uVar130,uVar139) || CARRY8(uVar137,uVar118)) +
                      (ulong)(CARRY8(uVar123,uVar128) || CARRY8(uVar138,uVar119));
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar126;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = uVar121;
            uVar136 = SUB168(auVar48 * auVar96,8);
            uVar114 = SUB168(auVar48 * auVar96,0);
            uVar119 = uVar140 + uVar114;
            uVar114 = (ulong)CARRY8(uVar140,uVar114);
            uVar118 = uVar137 + uVar136;
            uVar138 = uVar118 + uVar114;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = uVar113;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = uVar120;
            uVar120 = SUB168(auVar49 * auVar97,8);
            uVar126 = SUB168(auVar49 * auVar97,0);
            local_2450 = uVar119 + uVar126;
            uVar126 = (ulong)CARRY8(uVar119,uVar126);
            uVar119 = uVar138 + uVar120;
            auVar100._8_8_ =
                 (ulong)(CARRY8(uVar137,uVar136) || CARRY8(uVar118,uVar114)) +
                 (ulong)(CARRY8(uVar138,uVar120) || CARRY8(uVar119,uVar126));
            auVar100._0_8_ = uVar119 + uVar126;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar113;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = uVar121;
            local_2448 = auVar50 * auVar98 + auVar100;
            secp256k1_scalar_reduce_512(&local_2498,&local_2478);
            secp256k1_scalar_add(&local_24b8,s + uVar111,&local_2498);
            uVar114 = uVar135;
          }
          else {
            local_24b8.d[0] = s[uVar111].d[0];
            local_24b8.d[1] = s[uVar111].d[1];
            local_24b8.d[2] = s[uVar111].d[2];
            local_24b8.d[3] = (s[uVar111].d + 2)[1];
          }
          secp256k1_scalar_get_b32((uchar *)&local_2508,&local_24b8);
          lVar116 = 0;
          do {
            uVar104 = *(uint *)((long)&uStack_2500 + lVar116);
            uVar105 = *(uint *)((long)&uStack_2500 + lVar116 + 4);
            puVar1 = (uint *)((long)puVar124 + lVar116);
            uVar106 = puVar1[1];
            uVar107 = puVar1[2];
            uVar108 = puVar1[3];
            *(uint *)((long)&local_2508 + lVar116) =
                 *(uint *)((long)&local_2508 + lVar116) ^ *puVar1;
            *(uint *)((long)&local_2508 + lVar116 + 4) =
                 *(uint *)((long)&local_2508 + lVar116 + 4) ^ uVar106;
            *(uint *)((long)&uStack_2500 + lVar116) = uVar104 ^ uVar107;
            *(uint *)((long)&uStack_2500 + lVar116 + 4) = uVar105 ^ uVar108;
            lVar116 = lVar116 + 0x10;
          } while (lVar116 != 0x20);
          lVar116 = 0;
          do {
            uVar113 = uVar117 + lVar116;
            if (*mlen <= uVar113) goto LAB_004f91ef;
            local_24e0[lVar116 + uVar117] = *(uchar *)((long)&local_2508 + lVar116);
            lVar116 = lVar116 + 1;
          } while (lVar116 != 0x20);
          uVar113 = uVar117 + 0x20;
LAB_004f91ef:
          uVar126 = rsizes[sVar125];
          uVar118 = local_24c0;
        }
        uVar111 = uVar111 + 1;
        uVar134 = uVar134 + 1;
        puVar124 = puVar124 + 8;
        uVar117 = uVar113;
      } while (uVar134 < uVar126);
    }
    sVar125 = sVar125 + 1;
  } while (sVar125 != rings);
  iVar110 = 1;
  goto LAB_004f8c42;
LAB_004f8c26:
  lVar115 = -2;
  iVar110 = 0;
  bVar109 = !bVar145;
  bVar145 = false;
  if (bVar109) goto LAB_004f8c3b;
  goto LAB_004f8bc1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_rewind_inner(secp256k1_scalar *blind, uint64_t *v,
 unsigned char *m, size_t *mlen, secp256k1_scalar *ev, secp256k1_scalar *s,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge *genp) {
    secp256k1_scalar s_orig[128];
    secp256k1_scalar sec[32];
    secp256k1_scalar stmp;
    unsigned char prep[4096];
    unsigned char tmp[32];
    uint64_t value;
    size_t offset;
    size_t i;
    size_t j;
    int b;
    size_t skip1;
    size_t skip2;
    size_t npub;
    npub = ((rings - 1) << 2) + rsizes[rings-1];
    VERIFY_CHECK(npub <= 128);
    VERIFY_CHECK(npub >= 1);
    memset(prep, 0, 4096);
    /* Reconstruct the provers random values. */
    secp256k1_rangeproof_genrand(sec, s_orig, prep, rsizes, rings, nonce, commit, proof, len, genp);
    *v = UINT64_MAX;
    secp256k1_scalar_clear(blind);
    if (rings == 1 && rsizes[0] == 1) {
        /* With only a single proof, we can only recover the blinding factor. */
        secp256k1_rangeproof_recover_x(blind, &s_orig[0], &ev[0], &s[0]);
        if (v) {
            *v = 0;
        }
        if (mlen) {
            *mlen = 0;
        }
        return 1;
    }
    npub = (rings - 1) << 2;
    for (j = 0; j < 2; j++) {
        size_t idx;
        /* Look for a value encoding in the last ring. */
        idx = npub + rsizes[rings - 1] - 1 - j;
        secp256k1_scalar_get_b32(tmp, &s[idx]);
        secp256k1_rangeproof_ch32xor(tmp, &prep[idx * 32]);
        if ((tmp[0] & 128) && (memcmp(&tmp[16], &tmp[24], 8) == 0) && (memcmp(&tmp[8], &tmp[16], 8) == 0)) {
            value = 0;
            for (i = 0; i < 8; i++) {
                value = (value << 8) + tmp[24 + i];
            }
            if (v) {
                *v = value;
            }
            memcpy(&prep[idx * 32], tmp, 32);
            break;
        }
    }
    if (j > 1) {
        /* Couldn't extract a value. */
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 = rsizes[rings - 1] - 1 - j;
    skip2 = ((value >> ((rings - 1) << 1)) & 3);
    if (skip1 == skip2) {
        /*Value is in wrong position.*/
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 += (rings - 1) << 2;
    skip2 += (rings - 1) << 2;
    /* Like in the rsize[] == 1 case, Having figured out which s is the one which was not forged, we can recover the blinding factor. */
    secp256k1_rangeproof_recover_x(&stmp, &s_orig[skip2], &ev[skip2], &s[skip2]);
    secp256k1_scalar_negate(&sec[rings - 1], &sec[rings - 1]);
    secp256k1_scalar_add(blind, &stmp, &sec[rings - 1]);
    if (!m || !mlen || *mlen == 0) {
        if (mlen) {
            *mlen = 0;
        }
        /* FIXME: cleanup in early out/failure cases. */
        return 1;
    }
    offset = 0;
    npub = 0;
    for (i = 0; i < rings; i++) {
        size_t idx;
        idx = (value >> (i << 1)) & 3;
        for (j = 0; j < rsizes[i]; j++) {
            if (npub == skip1 || npub == skip2) {
                npub++;
                continue;
            }
            if (idx == j) {
                /** For the non-forged signatures the signature is calculated instead of random, instead we recover the prover's nonces.
                 *  this could just as well recover the blinding factors and messages could be put there as is done for recovering the
                 *  blinding factor in the last ring, but it takes an inversion to recover x so it's faster to put the message data in k.
                 */
                secp256k1_rangeproof_recover_k(&stmp, &sec[i], &ev[npub], &s[npub]);
            } else {
                stmp = s[npub];
            }
            secp256k1_scalar_get_b32(tmp, &stmp);
            secp256k1_rangeproof_ch32xor(tmp, &prep[npub * 32]);
            for (b = 0; b < 32 && offset < *mlen; b++) {
                m[offset] = tmp[b];
                offset++;
            }
            npub++;
        }
    }
    *mlen = offset;
    memset(prep, 0, 4096);
    for (i = 0; i < 128; i++) {
        secp256k1_scalar_clear(&s_orig[i]);
    }
    for (i = 0; i < 32; i++) {
        secp256k1_scalar_clear(&sec[i]);
    }
    secp256k1_scalar_clear(&stmp);
    return 1;
}